

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

void __thiscall QUnixPrintWidgetPrivate::setupPrinterProperties(QUnixPrintWidgetPrivate *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QAbstractPrintDialog *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  OutputFormat outputFormat;
  QString printerName;
  OutputFormat in_stack_00000074;
  QPrintDevice *in_stack_00000078;
  QPrinter *in_stack_00000080;
  QPrintPropertiesDialog *in_stack_00000088;
  QString *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  PrintDialogOption option;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  option = (PrintDialogOption)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long **)(in_RDI + 8) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x20))();
  }
  QString::QString((QString *)0x170db5);
  bVar2 = QPrintDialog::testOption
                    ((QPrintDialog *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     option);
  if (bVar2) {
    iVar3 = QComboBox::currentIndex();
    iVar4 = QComboBox::count();
    if (iVar3 == iVar4 + -1) goto LAB_00170e3e;
  }
  QComboBox::currentText();
  QString::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QString::~QString((QString *)0x170e3e);
LAB_00170e3e:
  this_00 = (QAbstractPrintDialog *)operator_new(0x88);
  QAbstractPrintDialog::printer(this_00);
  QPrintPropertiesDialog::QPrintPropertiesDialog
            (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000074,
             (QString *)printerName.d.size,(QAbstractPrintDialog *)printerName.d.ptr);
  *(QAbstractPrintDialog **)(in_RDI + 8) = this_00;
  QString::~QString((QString *)0x170eaa);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUnixPrintWidgetPrivate::setupPrinterProperties()
{
    delete propertiesDialog;

    QPrinter::OutputFormat outputFormat;
    QString printerName;

    if (q->testOption(QPrintDialog::PrintToFile)
        && (widget.printers->currentIndex() == widget.printers->count() - 1)) {// PDF
        outputFormat = QPrinter::PdfFormat;
    } else {
        outputFormat = QPrinter::NativeFormat;
        printerName = widget.printers->currentText();
    }

    propertiesDialog = new QPrintPropertiesDialog(q->printer(), &m_currentPrintDevice, outputFormat, printerName, q);
}